

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-test.cpp
# Opt level: O1

FileInfoWrapper<ASDCP::TimedText::MXFReader,_MyTextDescriptor> * __thiscall
FileInfoWrapper<ASDCP::TimedText::MXFReader,_MyTextDescriptor>::file_info
          (FileInfoWrapper<ASDCP::TimedText::MXFReader,_MyTextDescriptor> *this,
          CommandOptions *Options,char *type_string,IFileReaderFactory *fileReaderFactory,
          FILE *stream)

{
  _List_node_base *p_Var1;
  MXFReader Reader;
  MyTextDescriptor Desc;
  WriterInfo WI;
  undefined1 auStack_258 [16];
  undefined1 local_248 [32];
  _Alloc_hider local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  _Alloc_hider local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _List_node_base local_1e8;
  _Alloc_hider local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  WriterInfo local_1b0;
  undefined1 local_100 [104];
  
  if (type_string == (char *)0x0) {
    __assert_fail("type_string",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/asdcp-test.cpp"
                  ,0x6f0,
                  "static Result_t FileInfoWrapper<ASDCP::TimedText::MXFReader, MyTextDescriptor>::file_info(CommandOptions &, const char *, const Kumu::IFileReaderFactory &, FILE *) [ReaderT = ASDCP::TimedText::MXFReader, DescriptorT = MyTextDescriptor]"
                 );
  }
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stdout;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  if ((Options->verbose_flag != false) || (Options->showheader_flag == true)) {
    ASDCP::TimedText::MXFReader::MXFReader((MXFReader *)auStack_258,fileReaderFactory);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_248,Options->filenames[0],(allocator<char> *)local_100);
    ASDCP::TimedText::MXFReader::OpenRead((string *)&local_1b0);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_1b0);
    Kumu::Result_t::~Result_t((Result_t *)&local_1b0);
    if (local_248._0_8_ != (long)local_248 + 0x10) {
      operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
    }
    if (*(int *)this < 0) {
      if ((*(int *)this == ASDCP::RESULT_FORMAT) && (Options->showheader_flag == true)) {
        ASDCP::TimedText::MXFReader::DumpHeaderMetadata((_IO_FILE *)auStack_258);
      }
    }
    else {
      fprintf(_stdout,"File essence type is %s.\n",type_string);
      if (Options->showheader_flag == true) {
        ASDCP::TimedText::MXFReader::DumpHeaderMetadata((_IO_FILE *)auStack_258);
      }
      ASDCP::WriterInfo::WriterInfo(&local_1b0);
      ASDCP::TimedText::MXFReader::FillWriterInfo((WriterInfo *)&stack0xffffffffffffff68);
      Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
      ASDCP::WriterInfoDump(&local_1b0,(_IO_FILE *)stream);
      ASDCP::TimedText::TimedTextDescriptor::TimedTextDescriptor((TimedTextDescriptor *)local_248);
      ASDCP::TimedText::MXFReader::FillTimedTextDescriptor((TimedTextDescriptor *)local_100);
      Kumu::Result_t::~Result_t((Result_t *)local_100);
      ASDCP::TimedText::DescriptorDump((TimedTextDescriptor *)local_248,(_IO_FILE *)stream);
      if (Options->showindex_flag == true) {
        ASDCP::TimedText::MXFReader::DumpIndex((_IO_FILE *)auStack_258);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_p != &local_1c0) {
        operator_delete(local_1d0._M_p,local_1c0._M_allocated_capacity + 1);
      }
      while (local_1e8._M_next != &local_1e8) {
        p_Var1 = (local_1e8._M_next)->_M_next;
        operator_delete(local_1e8._M_next,0x28);
        local_1e8._M_next = p_Var1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_p != &local_1f8) {
        operator_delete(local_208._M_p,
                        (ulong)((long)&((_IO_marker *)local_1f8._M_allocated_capacity)->_next + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_p != &local_218) {
        operator_delete(local_228._M_p,(ulong)(local_218._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0.ProductName._M_dataplus._M_p != &local_1b0.ProductName.field_2) {
        operator_delete(local_1b0.ProductName._M_dataplus._M_p,
                        local_1b0.ProductName.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0.CompanyName._M_dataplus._M_p != &local_1b0.CompanyName.field_2) {
        operator_delete(local_1b0.CompanyName._M_dataplus._M_p,
                        local_1b0.CompanyName.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0.ProductVersion._M_dataplus._M_p != &local_1b0.ProductVersion.field_2) {
        operator_delete(local_1b0.ProductVersion._M_dataplus._M_p,
                        local_1b0.ProductVersion.field_2._M_allocated_capacity + 1);
      }
    }
    ASDCP::TimedText::MXFReader::~MXFReader((MXFReader *)auStack_258);
  }
  return this;
}

Assistant:

static Result_t
  file_info(CommandOptions& Options, const char* type_string, const Kumu::IFileReaderFactory& fileReaderFactory, FILE* stream = 0)
  {
    assert(type_string);
    if ( stream == 0 )
      stream = stdout;

    Result_t result = RESULT_OK;

    if ( Options.verbose_flag || Options.showheader_flag )
      {
	ReaderT     Reader(fileReaderFactory);
	result = Reader.OpenRead(Options.filenames[0]);

	if ( ASDCP_SUCCESS(result) )
	  {
	    fprintf(stdout, "File essence type is %s.\n", type_string);

	    if ( Options.showheader_flag )
	      Reader.DumpHeaderMetadata(stream);

	    WriterInfo WI;
	    Reader.FillWriterInfo(WI);
	    WriterInfoDump(WI, stream);

	    DescriptorT Desc;
	    Desc.FillDescriptor(Reader);
	    Desc.Dump(stream);

	    if ( Options.showindex_flag )
	      Reader.DumpIndex(stream);
	  }
	else if ( result == RESULT_FORMAT && Options.showheader_flag )
	  {
	    Reader.DumpHeaderMetadata(stream);
	  }
      }

    return result;
  }